

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseExtGNU_StatementExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  int iVar2;
  SyntaxToken *pSVar3;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  ExtGNU_EnclosedCompoundStatementExpressionSyntax *pEVar4;
  IndexType IVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  allocator<char> local_39;
  StatementSyntax *statement;
  
  pSVar3 = peek(this,1);
  if ((pSVar3->syntaxK_ == OpenParenToken) &&
     (pSVar3 = peek(this,2), pSVar3->syntaxK_ == OpenBraceToken)) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_StatementExpressions(this_01);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statement,"GNU statement expressions",&local_39);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,(string *)&statement);
      std::__cxx11::string::~string((string *)&statement);
    }
    pEVar4 = makeNode<psy::C::ExtGNU_EnclosedCompoundStatementExpressionSyntax>(this);
    *expr = &pEVar4->super_ExpressionSyntax;
    IVar5 = consume(this);
    pEVar4->openParenTkIdx_ = IVar5;
    statement = (StatementSyntax *)0x0;
    parseCompoundStatement_AtFirst(this,&statement,None);
    iVar2 = (*(statement->super_SyntaxNode).super_Managed._vptr_Managed[0xa8])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*(statement->super_SyntaxNode).super_Managed._vptr_Managed[0xa8])();
      pEVar4->stmt_ = (CompoundStatementSyntax *)CONCAT44(extraout_var_00,iVar2);
    }
    bVar1 = matchOrSkipTo(this,CloseParenToken,&pEVar4->closeParenTkIdx_);
    return bVar1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xe7);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"assert failure: `(\' then `{\'");
  std::endl<char,std::char_traits<char>>(poVar6);
  return false;
}

Assistant:

bool Parser::parseExtGNU_StatementExpression_AtFirst(ExpressionSyntax *&expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken
                        && peek(2).kind() == SyntaxKind::OpenBraceToken,
                  return false,
                  "assert failure: `(' then `{'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_StatementExpressions())
        diagReporter_.ExpectedFeature("GNU statement expressions");

    auto gnuExpr = makeNode<ExtGNU_EnclosedCompoundStatementExpressionSyntax>();
    expr = gnuExpr;
    gnuExpr->openParenTkIdx_ = consume();

    StatementSyntax* statement = nullptr;
    parseCompoundStatement_AtFirst(statement, StatementContext::None);
    if (statement->asCompoundStatement())
        gnuExpr->stmt_ = statement->asCompoundStatement();
    return matchOrSkipTo(SyntaxKind::CloseParenToken, &gnuExpr->closeParenTkIdx_);
}